

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O1

bool anon_unknown.dwarf_5f699::isNullableAndMutable(Expression *ref,Index fieldIndex)

{
  ulong *puVar1;
  int iVar2;
  long *plVar3;
  bool bVar4;
  Type local_40;
  ulong local_38;
  undefined8 uStack_30;
  char local_28;
  uintptr_t local_18;
  
  local_40.id = (ref->type).id;
  if ((local_40.id & 1) == 0 && 6 < local_40.id) {
    local_18 = (uintptr_t)wasm::Type::getHeapType(&local_40);
    iVar2 = wasm::HeapType::getKind();
    if (iVar2 == 3) {
      wasm::HeapType::getArray();
    }
    else {
      if (iVar2 != 2) {
        local_28 = '\0';
        goto LAB_00146d77;
      }
      plVar3 = (long *)wasm::HeapType::getStruct();
      puVar1 = (ulong *)(*plVar3 + (ulong)fieldIndex * 0x10);
      local_38 = *puVar1;
      uStack_30 = puVar1[1];
    }
    local_28 = '\x01';
  }
  else {
    local_28 = '\0';
  }
LAB_00146d77:
  if (local_28 == '\0') {
    __assert_fail("field",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-ctor-eval.cpp"
                  ,0x3e,"bool (anonymous namespace)::isNullableAndMutable(Expression *, Index)");
  }
  if (((uint)local_38 & 3) == 2 && 6 < local_38) {
    bVar4 = uStack_30._4_4_ == 1;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool isNullableAndMutable(Expression* ref, Index fieldIndex) {
  // Find the field for the given reference, and check its properties.
  auto field = GCTypeUtils::getField(ref->type, fieldIndex);
  assert(field);
  return field->type.isNullable() && field->mutable_ == Mutable;
}